

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O3

void __thiscall Kuhn::Game::step(Game *this,int action)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  bool bVar6;
  int iVar7;
  int *piVar8;
  int iVar9;
  int i;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  bool bVar13;
  uint uVar14;
  char local_a [2];
  int local_8 [2];
  array<int,_3UL> *paVar5;
  
  uVar11 = (ulong)(uint)action;
  if (this->mCurrentPlayer == 3) {
    this->mChanceProbability = 0.16666666666666666;
    (this->mCards)._M_elems[0] = 0;
    (this->mCards)._M_elems[1] = 1;
    (this->mCards)._M_elems[2] = 2;
    uVar3 = 4;
    iVar9 = 3;
    do {
      iVar1 = (this->mCards)._M_elems[uVar3 - 2];
      iVar7 = (int)uVar11;
      uVar11 = (long)iVar7 / (long)iVar9 & 0xffffffff;
      iVar7 = iVar7 % iVar9;
      (this->mCards)._M_elems[uVar3 - 2] = (this->mCards)._M_elems[iVar7];
      (this->mCards)._M_elems[iVar7] = iVar1;
      uVar3 = uVar3 - 1;
      iVar9 = iVar9 + -1;
    } while (2 < uVar3);
    iVar9 = (this->mCards)._M_elems[1];
    this->mInfoSets[0][0] = (uint8_t)(this->mCards)._M_elems[0];
    this->mInfoSets[1][0] = (uint8_t)iVar9;
    this->mTurnNum = 0;
    this->mCurrentPlayer = 0;
    this->mFirstBetTurn = -1;
    this->mBetPlayerNum = 0;
    this->mDone = false;
    return;
  }
  iVar9 = this->mTurnNum;
  this->mTurnNum = iVar9 + 1;
  this->mBetPlayerNum = this->mBetPlayerNum + action;
  this->mInfoSets[0][(long)iVar9 + 1] = (uint8_t)action;
  this->mInfoSets[1][this->mTurnNum] = (uint8_t)action;
  uVar14 = this->mTurnNum;
  uVar12 = this->mFirstBetTurn;
  if (action == 1 && this->mFirstBetTurn == 0xffffffff) {
    this->mFirstBetTurn = uVar14;
    uVar12 = uVar14;
  }
  uVar2 = (int)uVar14 % 2;
  if ((int)uVar14 < 2) goto LAB_001111f1;
  if ((int)uVar12 < 1) {
    if (uVar12 != 0xffffffff || uVar14 != 2) goto LAB_00111192;
    bVar13 = this->mInfoSets[0][2] == '\0';
LAB_00111194:
    iVar9 = this->mBetPlayerNum;
    if (iVar9 != 2) {
      if (!bVar13) goto LAB_001111f1;
      goto LAB_001111f9;
    }
LAB_0011119c:
    paVar5 = (array<int,_3UL> *)((this->mCards)._M_elems + 1);
    if ((this->mCards)._M_elems[1] <= (this->mCards)._M_elems[0]) {
      paVar5 = &this->mCards;
    }
    lVar4 = (long)paVar5 - (long)&this->mCards;
    *(undefined8 *)((long)this + lVar4 * 2 + 0x18) = 0x4000000000000000;
    lVar10 = 0;
    bVar13 = true;
    do {
      bVar6 = bVar13;
      if (lVar4 >> 2 != lVar10) {
        (this->mPayoff)._M_elems[lVar10] = -2.0;
      }
      lVar10 = 1;
      bVar13 = false;
    } while (bVar6);
  }
  else {
    if (uVar14 - uVar12 != 1) {
LAB_00111192:
      bVar13 = false;
      goto LAB_00111194;
    }
    iVar9 = this->mBetPlayerNum;
    if (iVar9 == 2) goto LAB_0011119c;
LAB_001111f9:
    if (iVar9 == 1) {
      (this->mPayoff)._M_elems[uVar2] = 1.0;
      uVar11 = 0;
      bVar13 = true;
      do {
        bVar6 = bVar13;
        if (uVar11 != uVar2) {
          (this->mPayoff)._M_elems[uVar11] = -1.0;
        }
        uVar11 = 1;
        bVar13 = false;
      } while (bVar6);
    }
    else if (iVar9 == 0) {
      paVar5 = (array<int,_3UL> *)((this->mCards)._M_elems + 1);
      if ((this->mCards)._M_elems[1] <= (this->mCards)._M_elems[0]) {
        paVar5 = &this->mCards;
      }
      lVar4 = (long)paVar5 - (long)&this->mCards;
      *(undefined8 *)((long)this + lVar4 * 2 + 0x18) = 0x3ff0000000000000;
      lVar10 = 0;
      bVar13 = true;
      do {
        bVar6 = bVar13;
        if (lVar4 >> 2 != lVar10) {
          (this->mPayoff)._M_elems[lVar10] = -1.0;
        }
        lVar10 = 1;
        bVar13 = false;
      } while (bVar6);
    }
    else {
      if (iVar9 < 2) goto LAB_001111f1;
      local_8[0] = -1;
      local_8[1] = -1;
      local_a[0] = '\0';
      local_a[1] = '\0';
      uVar11 = 0;
      do {
        if (this->mInfoSets[0][uVar11 + 1] == '\x01') {
          uVar12 = (uint)uVar11 & 1;
          uVar3 = (ulong)(uVar12 * 4);
          *(undefined4 *)((long)local_8 + uVar3) =
               *(undefined4 *)((long)(this->mCards)._M_elems + uVar3);
          local_a[uVar12] = '\x01';
        }
        uVar11 = uVar11 + 1;
      } while (uVar14 != uVar11);
      piVar8 = local_8 + 1;
      if (local_8[1] <= local_8[0]) {
        piVar8 = local_8;
      }
      lVar4 = (long)piVar8 - (long)local_8;
      *(double *)((long)this + lVar4 * 2 + 0x18) = (double)iVar9;
      lVar10 = 0;
      bVar13 = true;
      do {
        bVar6 = bVar13;
        uVar14 = 0xbff00000;
        if ((local_a[lVar10] != '\x01') || (uVar14 = 0xc0000000, lVar4 >> 2 != lVar10)) {
          (this->mPayoff)._M_elems[lVar10] = (double)((ulong)uVar14 << 0x20);
        }
        lVar10 = 1;
        bVar13 = false;
      } while (bVar6);
    }
  }
  this->mDone = true;
LAB_001111f1:
  this->mCurrentPlayer = uVar2;
  return;
}

Assistant:

void Game::step(const int action) {
    // chance node action
    if (mCurrentPlayer == PlayerNum + 1) {
        constexpr int ChanceAN = ChanceActionNum();
        mChanceProbability = 1.0 / double(ChanceAN);
        for (int i = 0; i < CardNum; ++i) {
            mCards[i] = i;
        }
        // shuffle cards
        int a = action;
        for (int c1 = int(mCards.size()) - 1; c1 > 0; --c1) {
            const int c2 = a % (c1 + 1);
            const int tmp = mCards[c1];
            mCards[c1] = mCards[c2];
            mCards[c2] = tmp;
            a = (int) a / (c1 + 1);
        }
        for (int i = 0; i < PlayerNum; ++i) {
            mInfoSets[i][0] = mCards[i];
        }
        mTurnNum = 0;
        mCurrentPlayer = 0;
        mFirstBetTurn = -1;
        mBetPlayerNum = 0;
        mDone = false;
        return;
    }

    // update history
    mTurnNum += 1;
    mBetPlayerNum += action;
    for (auto &infoSet : mInfoSets) {
        infoSet[mTurnNum] = action;
    }
    if (mFirstBetTurn == -1 && action == 1) {
        mFirstBetTurn = mTurnNum;
    }

    // update payoff
    const int plays = mTurnNum;
    const int player = plays % PlayerNum;
    int opponents[PlayerNum - 1];
    for (int i = 0; i < PlayerNum - 1; ++i) {
        opponents[i] = (player + i + 1) % PlayerNum;
    }
    if (plays > 1) {
        const bool terminalPass = (mFirstBetTurn > 0 && (mTurnNum - mFirstBetTurn == PlayerNum - 1)) || (mTurnNum == PlayerNum && mFirstBetTurn == -1 && mInfoSets[0][mTurnNum] == 0);
        // all bet
        if (mBetPlayerNum == PlayerNum) {
            const size_t winPlayer = std::distance(mCards.begin(), std::max_element(mCards.begin(), mCards.begin() + PlayerNum));
            mPayoff[winPlayer] = 2 * (PlayerNum - 1);
            for (int i = 0; i < PlayerNum; ++i) {
                if (i == winPlayer) {
                    continue;
                }
                mPayoff[i] = -2;
            }
            mDone = true;
        } else if (terminalPass) {
            // all fold
            if (mBetPlayerNum == 0) {
                const size_t winPlayer = std::distance(mCards.begin(), std::max_element(mCards.begin(), mCards.begin() + PlayerNum));
                mPayoff[winPlayer] = PlayerNum - 1;
                for (int i = 0; i < PlayerNum; ++i) {
                    if (i == winPlayer) {
                        continue;
                    }
                    mPayoff[i] = -1;
                }
                mDone = true;
            }
            // only one player bet
            else if (mBetPlayerNum == 1) {
                mPayoff[player] = PlayerNum - 1;
                for (int i = 0; i < PlayerNum; ++i) {
                    if (i == player) {
                        continue;
                    }
                    mPayoff[i] = -1;
                }
                mDone = true;
            }
            // more than two players bet
            else if (mBetPlayerNum >= 2) {
                std::array<int, PlayerNum> card{};
                card.fill(-1);
                std::array<bool, PlayerNum> isBet{};
                isBet.fill(false);
                for (int i = 0; i < mTurnNum; ++i) {
                    if (mInfoSets[0][i + 1] == 1) {
                        card[i % PlayerNum] = mCards[i % PlayerNum];
                        isBet[i % PlayerNum] = true;
                    }
                }
                const size_t winPlayer = std::distance(card.begin(), std::max_element(card.begin(), card.end()));
                mPayoff[winPlayer] = 2 * (mBetPlayerNum - 1) + (PlayerNum - mBetPlayerNum);
                for (int i = 0; i < PlayerNum; ++i) {
                    if (!isBet[i]) {
                        mPayoff[i] = -1;
                        continue;
                    }
                    if (i == winPlayer) {
                        continue;
                    }
                    mPayoff[i] = -2;
                }
                mDone = true;
            }
        }
    }
    mCurrentPlayer = player;
}